

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opmath.cpp
# Opt level: O1

int32_t op_exponent(int32_t base,uint32_t power)

{
  bool bVar1;
  int32_t iVar2;
  int iVar3;
  
  iVar2 = base;
  if ((power & 1) == 0) {
    iVar2 = 1;
  }
  if (1 < power) {
    do {
      base = base * base;
      iVar3 = base;
      if ((power & 2) == 0) {
        iVar3 = 1;
      }
      iVar2 = iVar2 * iVar3;
      bVar1 = 3 < power;
      power = power >> 1;
    } while (bVar1);
  }
  return iVar2;
}

Assistant:

int32_t op_exponent(int32_t base, uint32_t power)
{
	int32_t result = 1;

	for (;;) {
		if (power % 2)
			result *= base;
		power /= 2;
		if (!power)
			break;
		base *= base;
	}

	return result;
}